

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_setmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint uVar2;
  IRRef1 IVar3;
  uint uVar4;
  TRef TVar5;
  IROpT IVar6;
  uint uVar7;
  RecordIndex ix;
  TValue local_70 [6];
  uint local_40;
  
  uVar1 = *J->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    uVar2 = J->base[1];
    uVar7 = uVar2 & 0x1f000000;
    if ((uVar7 == 0xb000000) || (uVar7 == 0 && uVar2 != 0)) {
      local_70[0] = *rd->argv;
      local_40 = uVar1;
      lj_record_mm_lookup(J,(RecordIndex *)&local_70[0].field_2,MM_metatable);
      (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e050003;
      uVar4 = lj_opt_fold(J);
      if (uVar7 == 0) {
        TVar5 = lj_ir_knull(J,IRT_TAB);
        IVar3 = (IRRef1)TVar5;
        IVar6 = 0x4a0b;
      }
      else {
        (J->fold).ins.field_0.ot = 0x4a0b;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar2;
        lj_opt_fold(J);
        IVar6 = 0x520b;
        IVar3 = 0;
        uVar4 = uVar1;
      }
      (J->fold).ins.field_0.ot = IVar6;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar4;
      (J->fold).ins.field_0.op2 = IVar3;
      lj_opt_fold(J);
      *J->base = uVar1;
      J->needsnap = '\x01';
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_setmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef mt = J->base[1];
  if (tref_istab(tr) && (tref_istab(mt) || (mt && tref_isnil(mt)))) {
    TRef fref, mtref;
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    lj_record_mm_lookup(J, &ix, MM_metatable); /* Guard for no __metatable. */
    fref = emitir(IRT(IR_FREF, IRT_P32), tr, IRFL_TAB_META);
    mtref = tref_isnil(mt) ? lj_ir_knull(J, IRT_TAB) : mt;
    emitir(IRT(IR_FSTORE, IRT_TAB), fref, mtref);
    if (!tref_isnil(mt))
      emitir(IRT(IR_TBAR, IRT_TAB), tr, 0);
    J->base[0] = tr;
    J->needsnap = 1;
  }  /* else: Interpreter will throw. */
}